

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::js::Generator::GenerateClassConstructor
          (Generator *this,GeneratorOptions *options,Printer *printer,Descriptor *desc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Printer *this_00;
  bool bVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long *plVar6;
  size_type *psVar7;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar8;
  long lVar9;
  long lVar10;
  Descriptor *this_01;
  int iVar11;
  string local_d8;
  string local_b8;
  string local_98;
  Printer *local_78;
  string message_id;
  string local_50;
  
  (anonymous_namespace)::GetMessagePath_abi_cxx11_
            (&local_d8,(_anonymous_namespace_ *)(options->namespace_prefix)._M_dataplus._M_p,
             (GeneratorOptions *)(options->namespace_prefix)._M_string_length,desc);
  io::Printer::Print(printer,
                     "/**\n * Generated by JsPbCodeGenerator.\n * @param {Array=} opt_data Optional initial data array, typically from a\n * server response, or constructed directly in Javascript. The array is used\n * in place and becomes part of the constructed object. It is not cloned.\n * If no data is provided, the constructed object will be empty, but still\n * valid.\n * @extends {jspb.Message}\n * @constructor\n */\n$classname$ = function(opt_data) {\n"
                     ,"classname",&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  message_id._M_dataplus._M_p = (pointer)&message_id.field_2;
  message_id._M_string_length = 0;
  message_id.field_2._M_local_buf[0] = '\0';
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"0","");
  iVar3 = (int)extraout_RDX;
  local_78 = printer;
  if (*(int *)(desc + 0x2c) < 1) {
    iVar11 = 0;
  }
  else {
    lVar10 = 0;
    lVar9 = 0;
    iVar11 = 0;
    uVar8 = extraout_RDX;
    do {
      lVar5 = *(long *)(desc + 0x30);
      if (*(char *)(lVar5 + 0x50 + lVar10) == '\x01') {
        iVar3 = std::__cxx11::string::compare
                          ((char *)**(undefined8 **)(*(long *)(lVar5 + 0x58 + lVar10) + 0x10));
        uVar8 = extraout_RDX_00;
        if (iVar3 != 0) {
          lVar5 = *(long *)(desc + 0x30);
          goto LAB_0021f24b;
        }
      }
      else {
LAB_0021f24b:
        iVar3 = *(int *)(lVar5 + 0x38 + lVar10);
        if (iVar11 < iVar3) {
          iVar11 = iVar3;
        }
      }
      iVar3 = (int)uVar8;
      lVar9 = lVar9 + 1;
      lVar10 = lVar10 + 0xa8;
    } while (lVar9 < *(int *)(desc + 0x2c));
  }
  iVar4 = 0x1fffffff;
  if (iVar11 < 0x1fffffff) {
    iVar4 = iVar11;
  }
  this_01 = (Descriptor *)0xffffffff;
  if (0 < *(int *)(desc + 0x68)) {
    this_01 = (Descriptor *)(ulong)(iVar4 + 1);
  }
  SimpleItoa_abi_cxx11_(&local_50,(protobuf *)this_01,iVar3);
  bVar2 = anon_unknown_0::HasRepeatedFields((GeneratorOptions *)desc,this_01);
  this_00 = local_78;
  paVar1 = &local_d8.field_2;
  if (bVar2) {
    (anonymous_namespace)::GetMessagePath_abi_cxx11_
              (&local_d8,(_anonymous_namespace_ *)(options->namespace_prefix)._M_dataplus._M_p,
               (GeneratorOptions *)(options->namespace_prefix)._M_string_length,desc);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_d8);
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    psVar7 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_b8.field_2._M_allocated_capacity = *psVar7;
      local_b8.field_2._8_8_ = plVar6[3];
    }
    else {
      local_b8.field_2._M_allocated_capacity = *psVar7;
      local_b8._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_b8._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != paVar1) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    local_b8._M_string_length = 4;
    local_b8.field_2._M_allocated_capacity._0_5_ = 0x6c6c756e;
  }
  (anonymous_namespace)::OneofFieldsArrayName_abi_cxx11_
            (&local_d8,(_anonymous_namespace_ *)(options->namespace_prefix)._M_dataplus._M_p,
             (GeneratorOptions *)(options->namespace_prefix)._M_string_length,desc);
  io::Printer::Print(this_00,
                     "  jspb.Message.initialize(this, opt_data, $messageId$, $pivot$, $rptfields$, $oneoffields$);\n"
                     ,"messageId",&local_98,"pivot",&local_50,"rptfields",&local_b8,"oneoffields",
                     &local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  (anonymous_namespace)::GetMessagePath_abi_cxx11_
            (&local_d8,(_anonymous_namespace_ *)(options->namespace_prefix)._M_dataplus._M_p,
             (GeneratorOptions *)(options->namespace_prefix)._M_string_length,desc);
  io::Printer::Print(this_00,
                     "};\ngoog.inherits($classname$, jspb.Message);\nif (goog.DEBUG && !COMPILED) {\n  $classname$.displayName = \'$classname$\';\n}\n"
                     ,"classname",&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)message_id._M_dataplus._M_p != &message_id.field_2) {
    operator_delete(message_id._M_dataplus._M_p,
                    CONCAT71(message_id.field_2._M_allocated_capacity._1_7_,
                             message_id.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void Generator::GenerateClassConstructor(const GeneratorOptions& options,
                                         io::Printer* printer,
                                         const Descriptor* desc) const {
  printer->Print(
      "/**\n"
      " * Generated by JsPbCodeGenerator.\n"
      " * @param {Array=} opt_data Optional initial data array, typically "
      "from a\n"
      " * server response, or constructed directly in Javascript. The array "
      "is used\n"
      " * in place and becomes part of the constructed object. It is not "
      "cloned.\n"
      " * If no data is provided, the constructed object will be empty, but "
      "still\n"
      " * valid.\n"
      " * @extends {jspb.Message}\n"
      " * @constructor\n"
      " */\n"
      "$classname$ = function(opt_data) {\n",
      "classname", GetMessagePath(options, desc));
  string message_id = GetMessageId(desc);
  printer->Print(
      "  jspb.Message.initialize(this, opt_data, $messageId$, $pivot$, "
      "$rptfields$, $oneoffields$);\n",
      "messageId", !message_id.empty() ?
                   ("'" + message_id + "'") :
                   (IsResponse(desc) ? "''" : "0"),
      "pivot", GetPivot(desc),
      "rptfields", RepeatedFieldsArrayName(options, desc),
      "oneoffields", OneofFieldsArrayName(options, desc));
  printer->Print(
      "};\n"
      "goog.inherits($classname$, jspb.Message);\n"
      "if (goog.DEBUG && !COMPILED) {\n"
      "  $classname$.displayName = '$classname$';\n"
      "}\n",
      "classname", GetMessagePath(options, desc));
}